

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCompressedTexture.cpp
# Opt level: O1

void tcu::anon_unknown_0::EtcDecompressInternal::decompressETC2Block
               (deUint8 *dst,deUint64 src,deUint8 *alphaDst,bool alphaMode)

{
  bool bVar1;
  bool bVar2;
  deUint8 dVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  int x;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  undefined7 in_register_00000009;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  deUint8 dVar15;
  int iVar16;
  byte bVar17;
  int iVar18;
  int iVar19;
  char cVar20;
  byte bVar21;
  int iVar22;
  deUint8 *pdVar23;
  deUint8 *pdVar24;
  undefined1 uVar25;
  int pixelNdx;
  int iVar26;
  ulong uVar27;
  int pixelNdx_1;
  byte bVar28;
  uint uVar29;
  long lVar30;
  uint uVar31;
  int iVar32;
  bool bVar33;
  bool bVar34;
  byte local_76 [4];
  byte local_72 [4];
  byte local_6e [2];
  undefined4 local_6c;
  undefined4 local_68;
  uint local_64;
  deUint8 *local_60;
  ulong local_58;
  ulong local_50;
  deUint8 baseR [2];
  ulong uStack_48;
  deUint8 baseG [2];
  deUint8 *local_40;
  deUint32 table [2];
  
  local_60 = dst;
  uVar9 = (uint)(src >> 0x20);
  uVar29 = uVar9 >> 0x13 & 0x1f;
  uStack_48 = src >> 0x2b;
  uVar31 = uVar9 >> 0xb & 0x1f;
  local_50 = src >> 0x38;
  bVar4 = (byte)(src >> 0x38);
  uVar13 = bVar4 & 7;
  bVar21 = (byte)(src >> 0x30);
  bVar28 = (char)(bVar21 << 5) >> 7 & 0xf8U | bVar21 & 7;
  bVar6 = (byte)(src >> 0x28);
  bVar17 = (char)(bVar6 << 5) >> 7 & 0xf8U | bVar6 & 7;
  cVar20 = ((uVar13 < 4) << 3 | (byte)uVar13) - 8;
  local_6c = (int)CONCAT71(in_register_00000009,alphaMode);
  bVar2 = !alphaMode;
  bVar33 = (src >> 0x21 & 1) == 0;
  local_58 = src >> 0x3b;
  if (bVar33 && bVar2) {
    bVar34 = false;
LAB_0016584e:
    bVar1 = false;
  }
  else {
    if ((int)cVar20 + (uVar9 >> 0x1b) < 0x20) {
      if (0x1f < (int)(char)bVar28 + uVar29) {
        bVar5 = 1;
        bVar34 = false;
        bVar1 = false;
        goto LAB_00165886;
      }
      bVar34 = (int)(char)bVar17 + uVar31 < 0x20;
      goto LAB_0016584e;
    }
    bVar1 = true;
    bVar34 = false;
  }
  bVar5 = 0;
LAB_00165886:
  if ((bool)(bVar34 | (bVar33 && bVar2))) {
    local_68 = uVar9 >> 5 & 7;
    local_64 = uVar9 >> 2 & 7;
    if (bVar33 && bVar2) {
      local_76[0] = (byte)((uVar9 >> 0x1c) << 4) | bVar4 >> 4;
      local_76[1] = bVar4 << 4 | bVar4 & 0xf;
      bVar4 = (byte)(src >> 0x34);
      local_72[0] = bVar4 << 4 | bVar4 & 0xf;
      local_72[1] = bVar21 << 4 | bVar21 & 0xf;
      bVar4 = (byte)(src >> 0x2c);
      local_6e[0] = bVar4 << 4 | bVar4 & 0xf;
      local_6e[1] = bVar6 << 4 | bVar6 & 0xf;
    }
    else {
      bVar21 = cVar20 + (bVar4 >> 3);
      local_76[0] = bVar4 >> 5 | (bVar4 >> 3) * '\b';
      bVar4 = (byte)uVar29;
      bVar28 = bVar28 + bVar4;
      local_72[0] = bVar4 >> 2 | bVar4 * '\b';
      bVar4 = (byte)uVar31;
      bVar17 = bVar17 + bVar4;
      local_6e[0] = bVar4 >> 2 | bVar4 * '\b';
      local_76[1] = bVar21 >> 2 | bVar21 * '\b';
      local_72[1] = bVar28 >> 2 | bVar28 * '\b';
      local_6e[1] = bVar17 >> 2 | bVar17 * '\b';
    }
    bVar2 = (src >> 0x21 & 1) != 0;
    uVar27 = 0;
    do {
      uVar7 = uVar27 >> 2 & 0x3fffffff;
      uVar9 = (uint)uVar27 & 3;
      lVar30 = uVar7 + (ulong)uVar9 * 4;
      lVar8 = lVar30 * 3;
      if ((src >> 0x20 & 1) == 0) {
        uVar9 = (uint)uVar7;
      }
      bVar33 = 1 < uVar9;
      uVar9 = (uint)((src >> (uVar27 & 0x3f) & 1) != 0) +
              ((uint)(src >> ((char)uVar27 + 0x10U & 0x3f)) & 1) * 2;
      if (uVar9 != 2 || (bVar2 || !alphaMode)) {
        if ((bVar2 || !alphaMode) || (iVar10 = 0, (uVar9 & 0xfffffffd) != 0)) {
          iVar10 = decompressETC2Block::modifierTable[(uint)(&local_68)[bVar33]][uVar9];
        }
        iVar22 = (uint)local_76[bVar33] + iVar10;
        if (0xfe < iVar22) {
          iVar22 = 0xff;
        }
        if (iVar22 < 1) {
          iVar22 = 0;
        }
        dst[lVar8] = (deUint8)iVar22;
        iVar22 = (uint)local_72[bVar33] + iVar10;
        if (0xfe < iVar22) {
          iVar22 = 0xff;
        }
        if (iVar22 < 1) {
          iVar22 = 0;
        }
        dst[lVar8 + 1] = (deUint8)iVar22;
        iVar10 = iVar10 + (uint)local_6e[bVar33];
        if (0xfe < iVar10) {
          iVar10 = 0xff;
        }
        if (iVar10 < 1) {
          iVar10 = 0;
        }
        dst[lVar8 + 2] = (deUint8)iVar10;
        dVar3 = 0xff;
        if (alphaMode) goto LAB_00165bfa;
      }
      else {
        (dst + lVar8)[0] = '\0';
        (dst + lVar8)[1] = '\0';
        dst[lVar8 + 2] = '\0';
        dVar3 = '\0';
LAB_00165bfa:
        alphaDst[lVar30] = dVar3;
      }
      uVar27 = uVar27 + 1;
    } while (uVar27 != 0x10);
  }
  else {
    bVar17 = (byte)(src >> 0x2b);
    if ((bool)(bVar5 | bVar1)) {
      if (bVar1) {
        bVar17 = (byte)(src >> 0x34);
        bVar28 = (byte)(src >> 0x2c);
        bVar5 = (byte)(src >> 0x24);
        iVar10 = decompressETC2Block::distTable[uVar9 & 1 | uVar9 >> 1 & 6];
        bVar4 = (bVar4 & 3) + (bVar4 >> 3 & 3) * '\x04';
        local_76[0] = bVar17 << 4 | bVar17 & 0xf;
        local_72[0] = bVar21 << 4 | bVar21 & 0xf;
        bVar21 = bVar28 << 4 | bVar28 & 0xf;
        local_76[2] = bVar6 << 4 | bVar6 & 0xf;
        local_72[2] = bVar5 << 4 | bVar5 & 0xf;
        iVar22 = iVar10 + (uint)bVar21;
        if (0xfe < iVar22) {
          iVar22 = 0xff;
        }
        iVar32 = 0;
        if (iVar22 < 1) {
          iVar22 = iVar32;
        }
        iVar14 = iVar10 + (uint)local_76[2];
        if (0xfe < iVar14) {
          iVar14 = 0xff;
        }
        if (iVar14 < 1) {
          iVar14 = iVar32;
        }
        local_68._0_2_ = CONCAT11((char)iVar22,bVar4 * '\x10' | bVar4);
        local_76[1] = (char)iVar14;
        iVar22 = iVar10 + (uint)local_72[2];
        if (0xfe < iVar22) {
          iVar22 = 0xff;
        }
        local_72[1] = (char)iVar22;
        if (iVar22 < 1) {
          local_72[1] = 0;
        }
        iVar22 = (uint)bVar21 - iVar10;
        if (0xfe < iVar22) {
          iVar22 = 0xff;
        }
        uVar25 = (char)iVar22;
        if (iVar22 < 1) {
          uVar25 = 0;
        }
        local_68 = CONCAT13(uVar25,CONCAT12(bVar21,(undefined2)local_68));
        iVar22 = (uint)local_76[2] - iVar10;
        if (0xfe < iVar22) {
          iVar22 = 0xff;
        }
        if (iVar22 < 1) {
          iVar22 = iVar32;
        }
        local_76[3] = (char)iVar22;
        iVar10 = (uint)local_72[2] - iVar10;
      }
      else {
        bVar21 = (byte)(src >> 0x27);
        bVar6 = (byte)(src >> 0x23);
        bVar28 = (bVar4 >> 3) << 4 | bVar4 >> 3 & 0xf;
        uVar13 = (uVar9 >> 0x14 & 1) + uVar13 * 2;
        uVar31 = uVar13 * 0x10 | uVar13;
        uVar29 = (uVar9 >> 0xf & 7) + (uVar9 >> 0x13 & 1) * 8;
        uVar29 = uVar29 * 0x10 | uVar29;
        bVar17 = bVar17 << 4 | bVar17 & 0xf;
        bVar4 = bVar21 << 4 | bVar21 & 0xf;
        bVar21 = bVar6 << 4 | bVar6 & 0xf;
        iVar10 = decompressETC2Block::distTable
                 [(uint)(((uint)bVar4 << 8 | (uint)bVar17 << 0x10 | (uint)bVar21) <=
                        (uVar13 * 0x1100 | (uint)bVar28 << 0x10 | uVar29)) |
                  (uint)(src >> 0x1f) & 2 | uVar9 & 4];
        iVar22 = iVar10 + (uint)bVar28;
        if (0xfe < iVar22) {
          iVar22 = 0xff;
        }
        bVar5 = 0;
        bVar6 = (byte)iVar22;
        if (iVar22 < 1) {
          bVar6 = bVar5;
        }
        iVar22 = iVar10 + uVar31;
        if (0xfe < iVar22) {
          iVar22 = 0xff;
        }
        local_76[0] = (byte)iVar22;
        if (iVar22 < 1) {
          local_76[0] = bVar5;
        }
        iVar22 = iVar10 + uVar29;
        if (0xfe < iVar22) {
          iVar22 = 0xff;
        }
        local_72[0] = (byte)iVar22;
        if (iVar22 < 1) {
          local_72[0] = bVar5;
        }
        iVar22 = (uint)bVar28 - iVar10;
        if (0xfe < iVar22) {
          iVar22 = 0xff;
        }
        bVar28 = (byte)iVar22;
        if (iVar22 < 1) {
          bVar28 = bVar5;
        }
        local_68._0_2_ = CONCAT11(bVar28,bVar6);
        iVar22 = uVar31 - iVar10;
        if (0xfe < iVar22) {
          iVar22 = 0xff;
        }
        local_76[1] = (byte)iVar22;
        if (iVar22 < 1) {
          local_76[1] = bVar5;
        }
        iVar22 = uVar29 - iVar10;
        if (0xfe < iVar22) {
          iVar22 = 0xff;
        }
        local_72[1] = (byte)iVar22;
        if (iVar22 < 1) {
          local_72[1] = bVar5;
        }
        iVar22 = iVar10 + (uint)bVar17;
        if (0xfe < iVar22) {
          iVar22 = 0xff;
        }
        bVar6 = (byte)iVar22;
        if (iVar22 < 1) {
          bVar6 = bVar5;
        }
        iVar22 = iVar10 + (uint)bVar4;
        if (0xfe < iVar22) {
          iVar22 = 0xff;
        }
        uVar25 = 0;
        local_76[2] = (char)iVar22;
        if (iVar22 < 1) {
          local_76[2] = uVar25;
        }
        iVar22 = iVar10 + (uint)bVar21;
        if (0xfe < iVar22) {
          iVar22 = 0xff;
        }
        local_72[2] = (char)iVar22;
        if (iVar22 < 1) {
          local_72[2] = uVar25;
        }
        iVar22 = (uint)bVar17 - iVar10;
        if (0xfe < iVar22) {
          iVar22 = 0xff;
        }
        if (iVar22 < 1) {
          iVar22 = 0;
        }
        local_68 = CONCAT13((char)iVar22,CONCAT12(bVar6,(undefined2)local_68));
        iVar22 = (uint)bVar4 - iVar10;
        if (0xfe < iVar22) {
          iVar22 = 0xff;
        }
        local_76[3] = (char)iVar22;
        if (iVar22 < 1) {
          local_76[3] = uVar25;
        }
        iVar10 = (uint)bVar21 - iVar10;
      }
      iVar22 = 0xff;
      if (iVar10 < 0xff) {
        iVar22 = iVar10;
      }
      uVar9 = 0;
      local_72[3] = (byte)iVar22;
      if (iVar22 < 1) {
        local_72[3] = 0;
      }
      uVar27 = 0;
      do {
        uVar7 = (ulong)(uVar9 & 0xc | (uint)(uVar27 >> 2) & 0x3fffffff);
        lVar30 = uVar7 * 3;
        uVar13 = (uint)((src >> (uVar27 & 0x3f) & 1) != 0) +
                 ((uint)(src >> ((char)uVar27 + 0x10U & 0x3f)) & 1) * 2;
        if (uVar13 == 2 && ((src >> 0x21 & 1) == 0 && alphaMode)) {
          (dst + lVar30)[0] = '\0';
          (dst + lVar30)[1] = '\0';
          dst[lVar30 + 2] = '\0';
          dVar3 = '\0';
LAB_001660a2:
          alphaDst[uVar7] = dVar3;
        }
        else {
          uVar12 = (ulong)uVar13;
          dst[lVar30] = *(deUint8 *)((long)&local_68 + uVar12);
          dst[lVar30 + 1] = local_76[uVar12];
          dst[lVar30 + 2] = local_72[uVar12];
          dVar3 = 0xff;
          if (alphaMode) goto LAB_001660a2;
        }
        uVar27 = uVar27 + 1;
        uVar9 = uVar9 + 4;
      } while (uVar27 != 0x10);
    }
    else {
      bVar28 = bVar4 >> 5 & 3 | (bVar4 >> 1) * '\x04';
      uVar7 = src >> 0x19 & 0x7f;
      bVar6 = (byte)(src >> 0x13);
      uVar12 = src >> 0xd & 0x7ffff;
      uVar27 = src >> 6 & 0x3ffffff;
      bVar21 = (bVar17 & 3) << 3 | (bVar21 & 1) << 5;
      bVar17 = ((byte)(src >> 0x27) & 7 | bVar21) << 2 | bVar21 >> 4;
      bVar21 = (byte)(src >> 0x21);
      iVar22 = (uint)bVar17 * 4 + 2;
      bVar4 = bVar4 << 7 | ((byte)(src >> 0x31) & 0x3f) * '\x02' | bVar4 & 1;
      iVar10 = (uint)bVar4 * 4 + 2;
      iVar32 = (uint)bVar28 * 4 + 2;
      pdVar23 = dst + 2;
      lVar30 = 0;
      local_40 = alphaDst;
      do {
        lVar8 = 0;
        pdVar24 = pdVar23;
        iVar19 = iVar10;
        iVar14 = iVar22;
        iVar18 = iVar32;
        do {
          iVar16 = iVar18 >> 2;
          iVar11 = iVar19 >> 2;
          iVar26 = iVar14 >> 2;
          if (0xfe < iVar16) {
            iVar16 = 0xff;
          }
          dVar15 = '\0';
          dVar3 = (deUint8)iVar16;
          if (iVar16 < 1) {
            dVar3 = dVar15;
          }
          pdVar24[-2] = dVar3;
          if (0xfe < iVar11) {
            iVar11 = 0xff;
          }
          dVar3 = (deUint8)iVar11;
          if (iVar11 < 1) {
            dVar3 = dVar15;
          }
          pdVar24[-1] = dVar3;
          if (0xfe < iVar26) {
            iVar26 = 0xff;
          }
          dVar3 = (deUint8)iVar26;
          if (iVar26 < 1) {
            dVar3 = dVar15;
          }
          *pdVar24 = dVar3;
          if (alphaMode) {
            local_40[lVar8] = 0xff;
          }
          lVar8 = lVar8 + 1;
          iVar14 = iVar14 + ((uint)(byte)(bVar6 >> 4 & 3 | bVar6 * '\x04') - (uint)bVar17);
          iVar19 = iVar19 + ((uint)(byte)((byte)(uVar7 >> 6) | (char)uVar7 * '\x02') - (uint)bVar4);
          iVar18 = iVar18 + ((uint)(byte)(((byte)(src >> 0x20) & 1) << 2 |
                                         (bVar21 & 0x3e) << 2 | (bVar21 & 0x30) >> 4) - (uint)bVar28
                            );
          pdVar24 = pdVar24 + 3;
        } while (lVar8 != 4);
        lVar30 = lVar30 + 1;
        iVar22 = iVar22 + ((uint)(byte)((byte)(src >> 4) & 3 | (char)src * '\x04') - (uint)bVar17);
        iVar10 = iVar10 + ((uint)(byte)((byte)(uVar27 >> 6) & 1 | (char)uVar27 * '\x02') -
                          (uint)bVar4);
        iVar32 = iVar32 + ((uint)(byte)((byte)(uVar12 >> 4) & 3 | (char)uVar12 * '\x04') -
                          (uint)bVar28);
        pdVar23 = pdVar23 + 0xc;
        local_40 = local_40 + 4;
      } while (lVar30 != 4);
    }
  }
  return;
}

Assistant:

void decompressETC2Block (deUint8 dst[ETC2_UNCOMPRESSED_BLOCK_SIZE_RGB8], deUint64 src, deUint8 alphaDst[ETC2_UNCOMPRESSED_BLOCK_SIZE_A8], bool alphaMode)
{
	enum Etc2Mode
	{
		MODE_INDIVIDUAL = 0,
		MODE_DIFFERENTIAL,
		MODE_T,
		MODE_H,
		MODE_PLANAR,

		MODE_LAST
	};

	const int		diffOpaqueBit	= (int)getBit(src, 33);
	const deInt8	selBR			= (deInt8)getBits(src, 59, 63);	// 5 bits.
	const deInt8	selBG			= (deInt8)getBits(src, 51, 55);
	const deInt8	selBB			= (deInt8)getBits(src, 43, 47);
	const deInt8	selDR			= extendSigned3To8((deUint8)getBits(src, 56, 58)); // 3 bits.
	const deInt8	selDG			= extendSigned3To8((deUint8)getBits(src, 48, 50));
	const deInt8	selDB			= extendSigned3To8((deUint8)getBits(src, 40, 42));
	Etc2Mode		mode;

	if (!alphaMode && diffOpaqueBit == 0)
		mode = MODE_INDIVIDUAL;
	else if (!de::inRange(selBR + selDR, 0, 31))
		mode = MODE_T;
	else if (!de::inRange(selBG + selDG, 0, 31))
		mode = MODE_H;
	else if (!de::inRange(selBB + selDB, 0, 31))
		mode = MODE_PLANAR;
	else
		mode = MODE_DIFFERENTIAL;

	if (mode == MODE_INDIVIDUAL || mode == MODE_DIFFERENTIAL)
	{
		// Individual and differential modes have some steps in common, handle them here.
		static const int modifierTable[8][4] =
		{
		//	  00   01   10    11
			{  2,   8,  -2,   -8 },
			{  5,  17,  -5,  -17 },
			{  9,  29,  -9,  -29 },
			{ 13,  42, -13,  -42 },
			{ 18,  60, -18,  -60 },
			{ 24,  80, -24,  -80 },
			{ 33, 106, -33, -106 },
			{ 47, 183, -47, -183 }
		};

		const int		flipBit		= (int)getBit(src, 32);
		const deUint32	table[2]	= { getBits(src, 37, 39), getBits(src, 34, 36) };
		deUint8			baseR[2];
		deUint8			baseG[2];
		deUint8			baseB[2];

		if (mode == MODE_INDIVIDUAL)
		{
			// Individual mode, initial values.
			baseR[0] = extend4To8((deUint8)getBits(src, 60, 63));
			baseR[1] = extend4To8((deUint8)getBits(src, 56, 59));
			baseG[0] = extend4To8((deUint8)getBits(src, 52, 55));
			baseG[1] = extend4To8((deUint8)getBits(src, 48, 51));
			baseB[0] = extend4To8((deUint8)getBits(src, 44, 47));
			baseB[1] = extend4To8((deUint8)getBits(src, 40, 43));
		}
		else
		{
			// Differential mode, initial values.
			baseR[0] = extend5To8(selBR);
			baseG[0] = extend5To8(selBG);
			baseB[0] = extend5To8(selBB);

			baseR[1] = extend5To8((deUint8)(selBR + selDR));
			baseG[1] = extend5To8((deUint8)(selBG + selDG));
			baseB[1] = extend5To8((deUint8)(selBB + selDB));
		}

		// Write final pixels for individual or differential mode.
		for (int pixelNdx = 0; pixelNdx < ETC2_BLOCK_HEIGHT*ETC2_BLOCK_WIDTH; pixelNdx++)
		{
			const int		x				= pixelNdx / ETC2_BLOCK_HEIGHT;
			const int		y				= pixelNdx % ETC2_BLOCK_HEIGHT;
			const int		dstOffset		= (y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_RGB8;
			const int		subBlock		= ((flipBit ? y : x) >= 2) ? 1 : 0;
			const deUint32	tableNdx		= table[subBlock];
			const deUint32	modifierNdx		= (getBit(src, 16+pixelNdx) << 1) | getBit(src, pixelNdx);
			const int		alphaDstOffset	= (y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_A8; // Only needed for PUNCHTHROUGH version.

			// If doing PUNCHTHROUGH version (alphaMode), opaque bit may affect colors.
			if (alphaMode && diffOpaqueBit == 0 && modifierNdx == 2)
			{
				dst[dstOffset+0]			= 0;
				dst[dstOffset+1]			= 0;
				dst[dstOffset+2]			= 0;
				alphaDst[alphaDstOffset]	= 0;
			}
			else
			{
				int modifier;

				// PUNCHTHROUGH version and opaque bit may also affect modifiers.
				if (alphaMode && diffOpaqueBit == 0 && (modifierNdx == 0 || modifierNdx == 2))
					modifier = 0;
				else
					modifier = modifierTable[tableNdx][modifierNdx];

				dst[dstOffset+0] = (deUint8)deClamp32((int)baseR[subBlock] + modifier, 0, 255);
				dst[dstOffset+1] = (deUint8)deClamp32((int)baseG[subBlock] + modifier, 0, 255);
				dst[dstOffset+2] = (deUint8)deClamp32((int)baseB[subBlock] + modifier, 0, 255);

				if (alphaMode)
					alphaDst[alphaDstOffset] = 255;
			}
		}
	}
	else if (mode == MODE_T || mode == MODE_H)
	{
		// T and H modes have some steps in common, handle them here.
		static const int distTable[8] = { 3, 6, 11, 16, 23, 32, 41, 64 };

		deUint8 paintR[4];
		deUint8 paintG[4];
		deUint8 paintB[4];

		if (mode == MODE_T)
		{
			// T mode, calculate paint values.
			const deUint8	R1a			= (deUint8)getBits(src, 59, 60);
			const deUint8	R1b			= (deUint8)getBits(src, 56, 57);
			const deUint8	G1			= (deUint8)getBits(src, 52, 55);
			const deUint8	B1			= (deUint8)getBits(src, 48, 51);
			const deUint8	R2			= (deUint8)getBits(src, 44, 47);
			const deUint8	G2			= (deUint8)getBits(src, 40, 43);
			const deUint8	B2			= (deUint8)getBits(src, 36, 39);
			const deUint32	distNdx		= (getBits(src, 34, 35) << 1) | getBit(src, 32);
			const int		dist		= distTable[distNdx];

			paintR[0] = extend4To8((deUint8)((R1a << 2) | R1b));
			paintG[0] = extend4To8(G1);
			paintB[0] = extend4To8(B1);
			paintR[2] = extend4To8(R2);
			paintG[2] = extend4To8(G2);
			paintB[2] = extend4To8(B2);
			paintR[1] = (deUint8)deClamp32((int)paintR[2] + dist, 0, 255);
			paintG[1] = (deUint8)deClamp32((int)paintG[2] + dist, 0, 255);
			paintB[1] = (deUint8)deClamp32((int)paintB[2] + dist, 0, 255);
			paintR[3] = (deUint8)deClamp32((int)paintR[2] - dist, 0, 255);
			paintG[3] = (deUint8)deClamp32((int)paintG[2] - dist, 0, 255);
			paintB[3] = (deUint8)deClamp32((int)paintB[2] - dist, 0, 255);
		}
		else
		{
			// H mode, calculate paint values.
			const deUint8	R1		= (deUint8)getBits(src, 59, 62);
			const deUint8	G1a		= (deUint8)getBits(src, 56, 58);
			const deUint8	G1b		= (deUint8)getBit(src, 52);
			const deUint8	B1a		= (deUint8)getBit(src, 51);
			const deUint8	B1b		= (deUint8)getBits(src, 47, 49);
			const deUint8	R2		= (deUint8)getBits(src, 43, 46);
			const deUint8	G2		= (deUint8)getBits(src, 39, 42);
			const deUint8	B2		= (deUint8)getBits(src, 35, 38);
			deUint8			baseR[2];
			deUint8			baseG[2];
			deUint8			baseB[2];
			deUint32		baseValue[2];
			deUint32		distNdx;
			int				dist;

			baseR[0]		= extend4To8(R1);
			baseG[0]		= extend4To8((deUint8)((G1a << 1) | G1b));
			baseB[0]		= extend4To8((deUint8)((B1a << 3) | B1b));
			baseR[1]		= extend4To8(R2);
			baseG[1]		= extend4To8(G2);
			baseB[1]		= extend4To8(B2);
			baseValue[0]	= (((deUint32)baseR[0]) << 16) | (((deUint32)baseG[0]) << 8) | baseB[0];
			baseValue[1]	= (((deUint32)baseR[1]) << 16) | (((deUint32)baseG[1]) << 8) | baseB[1];
			distNdx			= (getBit(src, 34) << 2) | (getBit(src, 32) << 1) | (deUint32)(baseValue[0] >= baseValue[1]);
			dist			= distTable[distNdx];

			paintR[0]		= (deUint8)deClamp32((int)baseR[0] + dist, 0, 255);
			paintG[0]		= (deUint8)deClamp32((int)baseG[0] + dist, 0, 255);
			paintB[0]		= (deUint8)deClamp32((int)baseB[0] + dist, 0, 255);
			paintR[1]		= (deUint8)deClamp32((int)baseR[0] - dist, 0, 255);
			paintG[1]		= (deUint8)deClamp32((int)baseG[0] - dist, 0, 255);
			paintB[1]		= (deUint8)deClamp32((int)baseB[0] - dist, 0, 255);
			paintR[2]		= (deUint8)deClamp32((int)baseR[1] + dist, 0, 255);
			paintG[2]		= (deUint8)deClamp32((int)baseG[1] + dist, 0, 255);
			paintB[2]		= (deUint8)deClamp32((int)baseB[1] + dist, 0, 255);
			paintR[3]		= (deUint8)deClamp32((int)baseR[1] - dist, 0, 255);
			paintG[3]		= (deUint8)deClamp32((int)baseG[1] - dist, 0, 255);
			paintB[3]		= (deUint8)deClamp32((int)baseB[1] - dist, 0, 255);
		}

		// Write final pixels for T or H mode.
		for (int pixelNdx = 0; pixelNdx < ETC2_BLOCK_HEIGHT*ETC2_BLOCK_WIDTH; pixelNdx++)
		{
			const int		x				= pixelNdx / ETC2_BLOCK_HEIGHT;
			const int		y				= pixelNdx % ETC2_BLOCK_HEIGHT;
			const int		dstOffset		= (y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_RGB8;
			const deUint32	paintNdx		= (getBit(src, 16+pixelNdx) << 1) | getBit(src, pixelNdx);
			const int		alphaDstOffset	= (y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_A8; // Only needed for PUNCHTHROUGH version.

			if (alphaMode && diffOpaqueBit == 0 && paintNdx == 2)
			{
				dst[dstOffset+0]			= 0;
				dst[dstOffset+1]			= 0;
				dst[dstOffset+2]			= 0;
				alphaDst[alphaDstOffset]	= 0;
			}
			else
			{
				dst[dstOffset+0] = (deUint8)deClamp32((int)paintR[paintNdx], 0, 255);
				dst[dstOffset+1] = (deUint8)deClamp32((int)paintG[paintNdx], 0, 255);
				dst[dstOffset+2] = (deUint8)deClamp32((int)paintB[paintNdx], 0, 255);

				if (alphaMode)
					alphaDst[alphaDstOffset] = 255;
			}
		}
	}
	else
	{
		// Planar mode.
		const deUint8 GO1	= (deUint8)getBit(src, 56);
		const deUint8 GO2	= (deUint8)getBits(src, 49, 54);
		const deUint8 BO1	= (deUint8)getBit(src, 48);
		const deUint8 BO2	= (deUint8)getBits(src, 43, 44);
		const deUint8 BO3	= (deUint8)getBits(src, 39, 41);
		const deUint8 RH1	= (deUint8)getBits(src, 34, 38);
		const deUint8 RH2	= (deUint8)getBit(src, 32);
		const deUint8 RO	= extend6To8((deUint8)getBits(src, 57, 62));
		const deUint8 GO	= extend7To8((deUint8)((GO1 << 6) | GO2));
		const deUint8 BO	= extend6To8((deUint8)((BO1 << 5) | (BO2 << 3) | BO3));
		const deUint8 RH	= extend6To8((deUint8)((RH1 << 1) | RH2));
		const deUint8 GH	= extend7To8((deUint8)getBits(src, 25, 31));
		const deUint8 BH	= extend6To8((deUint8)getBits(src, 19, 24));
		const deUint8 RV	= extend6To8((deUint8)getBits(src, 13, 18));
		const deUint8 GV	= extend7To8((deUint8)getBits(src, 6, 12));
		const deUint8 BV	= extend6To8((deUint8)getBits(src, 0, 5));

		// Write final pixels for planar mode.
		for (int y = 0; y < 4; y++)
		{
			for (int x = 0; x < 4; x++)
			{
				const int dstOffset			= (y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_RGB8;
				const int unclampedR		= (x * ((int)RH-(int)RO) + y * ((int)RV-(int)RO) + 4*(int)RO + 2) >> 2;
				const int unclampedG		= (x * ((int)GH-(int)GO) + y * ((int)GV-(int)GO) + 4*(int)GO + 2) >> 2;
				const int unclampedB		= (x * ((int)BH-(int)BO) + y * ((int)BV-(int)BO) + 4*(int)BO + 2) >> 2;
				const int alphaDstOffset	= (y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_A8; // Only needed for PUNCHTHROUGH version.

				dst[dstOffset+0] = (deUint8)deClamp32(unclampedR, 0, 255);
				dst[dstOffset+1] = (deUint8)deClamp32(unclampedG, 0, 255);
				dst[dstOffset+2] = (deUint8)deClamp32(unclampedB, 0, 255);

				if (alphaMode)
					alphaDst[alphaDstOffset] = 255;
			}
		}
	}
}